

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

ssize_t __thiscall
ezc3d::DataNS::Points3dNS::Point::write(Point *this,int __fd,void *__buf,size_t __n)

{
  const_reference cVar1;
  int iVar2;
  undefined4 extraout_var;
  ssize_t sVar3;
  ulong uVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  long lVar6;
  size_t i_1;
  ulong __n_00;
  size_t i;
  ulong uVar7;
  uint in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float zero;
  undefined4 uStack_44;
  int minusOne;
  ulong local_38;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  local_38 = (ulong)in_XMM0_Da;
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])();
  if (0.0 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
    uVar7 = 0;
    while( true ) {
      iVar2 = (*(this->super_Vector3d).super_Matrix._vptr_Matrix[5])(this);
      if (CONCAT44(extraout_var,iVar2) <= uVar7) break;
      _zero = CONCAT44(uStack_44,
                       (float)(this->super_Vector3d).super_Matrix._data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7]);
      std::ostream::write((char *)(lVar6 + 0x10),(long)&zero);
      uVar7 = uVar7 + 1;
    }
    uVar7 = 0;
    for (__n_00 = 0;
        __n_00 < (ulong)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        __n_00 = __n_00 + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_cameraMasks,__n_00);
      uVar4 = uVar7 | 1L << (__n_00 & 0x3f);
      uVar7 = uVar7 & ~(1L << (__n_00 & 0x3f));
      if (cVar1) {
        uVar7 = uVar4;
      }
    }
    _zero = uVar7 & 0xffffffffffffff7f;
    std::ostream::write((char *)(lVar6 + 0x10),(long)&zero);
    minusOne = (int)(this->_residual / (double)ABS((float)local_38));
  }
  else {
    _zero = _zero & 0xffffffff00000000;
    minusOne = -0x4080;
    pcVar5 = (char *)(lVar6 + 0x10);
    std::ostream::write(pcVar5,(long)&zero);
    std::ostream::write(pcVar5,(long)&zero);
    std::ostream::write(pcVar5,(long)&zero);
    std::ostream::write(pcVar5,(long)&zero);
  }
  sVar3 = std::ostream::write((char *)(lVar6 + 0x10),(long)&minusOne);
  return sVar3;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::write(std::fstream &f,
                                             float scaleFactor) const {
  if (residual() >= 0) {
    for (size_t i = 0; i < size(); ++i) {
      float data(static_cast<float>(_data[i]));
      f.write(reinterpret_cast<const char *>(&data), ezc3d::DATA_TYPE::FLOAT);
    }
    std::bitset<8> cameraMasksBits;
    for (size_t i = 0; i < _cameraMasks.size(); ++i) {
      if (_cameraMasks[i]) {
        cameraMasksBits[i] = 1;
      } else {
        cameraMasksBits[i] = 0;
      }
    }
    cameraMasksBits[7] = 0;
    size_t cameraMasks(cameraMasksBits.to_ulong());
    f.write(reinterpret_cast<const char *>(&cameraMasks),
            ezc3d::DATA_TYPE::WORD);
    int residual(static_cast<int>(_residual / fabsf(scaleFactor)));
    f.write(reinterpret_cast<const char *>(&residual), ezc3d::DATA_TYPE::WORD);
  } else {
    float zero(0);
    int minusOne(-16512); // 0xbf80 - 0xFFFF - 1   This is the Qualisys and
                          // Vicon value for missing marker);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::WORD);
    f.write(reinterpret_cast<const char *>(&minusOne), ezc3d::DATA_TYPE::WORD);
  }
}